

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

void __thiscall OpenMD::RigidBody::addAtom(RigidBody *this,Atom *at,AtomStamp *ats)

{
  bool bVar1;
  undefined8 uVar2;
  double *pdVar3;
  value_type *__x;
  AtomStamp *in_RDX;
  RealType RVar4;
  SquareMatrix3<double> *this_00;
  double dVar5;
  RotMat3x3d Atmp;
  RotMat3x3d identMat;
  Vector3d euler;
  Vector3d coords;
  AtomStamp *in_stack_fffffffffffffdf8;
  SquareMatrix3<double> *in_stack_fffffffffffffe00;
  value_type *in_stack_fffffffffffffe08;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *in_stack_fffffffffffffe10;
  string local_128 [192];
  string local_68 [32];
  Vector<double,_3U> local_48;
  Vector<double,_3U> local_30;
  AtomStamp *local_18;
  
  local_18 = in_RDX;
  Vector3<double>::Vector3((Vector3<double> *)0x2cfe1c);
  Vector3<double>::Vector3((Vector3<double> *)0x2cfe29);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::push_back
            (in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
  bVar1 = AtomStamp::havePosition(local_18);
  if (!bVar1) {
    AtomStamp::getType_abi_cxx11_(in_stack_fffffffffffffdf8);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "RigidBody error.\n\tAtom %s does not have a position specified.\n\tThis means RigidBody cannot set up reference coordinates.\n"
             ,uVar2);
    std::__cxx11::string::~string(local_68);
    painCave.isFatal = 1;
    simError();
  }
  RVar4 = AtomStamp::getPosX((AtomStamp *)0x2cfec5);
  pdVar3 = Vector<double,_3U>::operator[](&local_30,0);
  *pdVar3 = RVar4;
  RVar4 = AtomStamp::getPosY((AtomStamp *)0x2cfef9);
  pdVar3 = Vector<double,_3U>::operator[](&local_30,1);
  *pdVar3 = RVar4;
  RVar4 = AtomStamp::getPosZ((AtomStamp *)0x2cff28);
  pdVar3 = Vector<double,_3U>::operator[](&local_30,2);
  *pdVar3 = RVar4;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             in_stack_fffffffffffffe10,(value_type *)in_stack_fffffffffffffe08);
  SquareMatrix<double,_3>::identity();
  SquareMatrix3<double>::SquareMatrix3
            (in_stack_fffffffffffffe00,(SquareMatrix<double,_3> *)in_stack_fffffffffffffdf8);
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x2cff9f);
  bVar1 = Atom::isDirectional((Atom *)0x2cffac);
  if (bVar1) {
    bVar1 = AtomStamp::haveOrientation(local_18);
    if (!bVar1) {
      AtomStamp::getType_abi_cxx11_(in_stack_fffffffffffffdf8);
      uVar2 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "RigidBody error.\n\tAtom %s does not have an orientation specified.\n\tThis means RigidBody cannot set up reference orientations.\n"
               ,uVar2);
      std::__cxx11::string::~string(local_128);
      painCave.isFatal = 1;
      simError();
    }
    RVar4 = AtomStamp::getEulerPhi((AtomStamp *)0x2d0099);
    pdVar3 = Vector<double,_3U>::operator[](&local_48,0);
    *pdVar3 = (RVar4 * 3.141592653589793) / 180.0;
    RVar4 = AtomStamp::getEulerTheta((AtomStamp *)0x2d00f7);
    pdVar3 = Vector<double,_3U>::operator[](&local_48,1);
    *pdVar3 = (RVar4 * 3.141592653589793) / 180.0;
    this_00 = (SquareMatrix3<double> *)AtomStamp::getEulerPsi((AtomStamp *)0x2d0158);
    dVar5 = ((double)this_00 * 3.141592653589793) / 180.0;
    __x = (value_type *)Vector<double,_3U>::operator[](&local_48,2);
    (__x->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] = dVar5;
    SquareMatrix3<double>::SquareMatrix3(this_00,(Vector3<double> *)__x);
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    push_back((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
               *)this_00,__x);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d01ee);
  }
  else {
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    push_back((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
               *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2d0240);
  return;
}

Assistant:

void RigidBody::addAtom(Atom* at, AtomStamp* ats) {
    Vector3d coords;
    Vector3d euler;

    atoms_.push_back(at);

    if (!ats->havePosition()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RigidBody error.\n"
               "\tAtom %s does not have a position specified.\n"
               "\tThis means RigidBody cannot set up reference coordinates.\n",
               ats->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    coords[0] = ats->getPosX();
    coords[1] = ats->getPosY();
    coords[2] = ats->getPosZ();

    refCoords_.push_back(coords);

    RotMat3x3d identMat = RotMat3x3d::identity();

    if (at->isDirectional()) {
      if (!ats->haveOrientation()) {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "RigidBody error.\n"
            "\tAtom %s does not have an orientation specified.\n"
            "\tThis means RigidBody cannot set up reference orientations.\n",
            ats->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }

      euler[0] = ats->getEulerPhi() * Constants::PI / 180.0;
      euler[1] = ats->getEulerTheta() * Constants::PI / 180.0;
      euler[2] = ats->getEulerPsi() * Constants::PI / 180.0;

      RotMat3x3d Atmp(euler);
      refOrients_.push_back(Atmp);

    } else {
      refOrients_.push_back(identMat);
    }
  }